

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::HardSigmoid_x86_avx::forward_inplace
          (HardSigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  int iVar12;
  long *in_RSI;
  long *in_RDI;
  __m128 _ans_1;
  __m128 _p_1;
  __m128 _one;
  __m128 _zero;
  __m256 _ans;
  __m256 _p;
  __m256 _one_avx;
  __m256 _zero_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  int local_550;
  float *local_4f8;
  int local_4ec;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  lVar11 = in_RSI[7];
  iVar12 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
           (int)in_RSI[3];
  for (local_4ec = 0; local_4ec < (int)lVar11; local_4ec = local_4ec + 1) {
    local_4f8 = (float *)(*in_RSI + in_RSI[8] * (long)local_4ec * in_RSI[2]);
    local_550 = 0;
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
    uStack_170 = auVar4._0_8_;
    uStack_168 = auVar4._8_8_;
    for (; local_550 + 7 < iVar12; local_550 = local_550 + 8) {
      uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
      auVar8 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x30);
      local_400 = (float)*(undefined8 *)local_4f8;
      fStack_3fc = (float)((ulong)*(undefined8 *)local_4f8 >> 0x20);
      fStack_3f8 = (float)*(undefined8 *)(local_4f8 + 2);
      fStack_3f4 = (float)((ulong)*(undefined8 *)(local_4f8 + 2) >> 0x20);
      fStack_3f0 = (float)*(undefined8 *)(local_4f8 + 4);
      fStack_3ec = (float)((ulong)*(undefined8 *)(local_4f8 + 4) >> 0x20);
      fStack_3e8 = (float)*(undefined8 *)(local_4f8 + 6);
      fStack_3e4 = (float)((ulong)*(undefined8 *)(local_4f8 + 6) >> 0x20);
      local_80 = auVar8._0_4_;
      fStack_7c = auVar8._4_4_;
      fStack_78 = auVar8._8_4_;
      fStack_74 = auVar8._12_4_;
      fStack_70 = auVar7._0_4_;
      fStack_6c = auVar7._4_4_;
      fStack_68 = auVar7._8_4_;
      local_c0 = auVar4._0_4_;
      fStack_bc = auVar4._4_4_;
      fStack_b8 = auVar4._8_4_;
      fStack_b4 = auVar4._12_4_;
      fStack_b0 = auVar6._0_4_;
      fStack_ac = auVar6._4_4_;
      fStack_a8 = auVar6._8_4_;
      fStack_a4 = auVar6._12_4_;
      local_5e0._4_4_ = fStack_3fc * fStack_7c + fStack_bc;
      local_5e0._0_4_ = local_400 * local_80 + local_c0;
      uStack_5d8._0_4_ = fStack_3f8 * fStack_78 + fStack_b8;
      uStack_5d8._4_4_ = fStack_3f4 * fStack_74 + fStack_b4;
      uStack_5d0._0_4_ = fStack_3f0 * fStack_70 + fStack_b0;
      uStack_5d0._4_4_ = fStack_3ec * fStack_6c + fStack_ac;
      uStack_5c8._0_4_ = fStack_3e8 * fStack_68 + fStack_a8;
      uStack_5c8._4_4_ = fStack_3e4 + fStack_a4;
      auVar9 = _local_5e0;
      uStack_5c8 = auVar9._24_8_;
      auVar9._16_8_ = uStack_5d0;
      auVar9._0_16_ = _local_5e0;
      auVar9._24_8_ = uStack_5c8;
      auVar9 = vmaxps_avx(auVar9,ZEXT1632(ZEXT816(0)));
      auVar10._16_8_ = uStack_170;
      auVar10._0_16_ = auVar5;
      auVar10._24_8_ = uStack_168;
      auVar9 = vminps_avx(auVar9,auVar10);
      local_5e0 = auVar9._0_8_;
      uStack_5d8 = auVar9._8_8_;
      uStack_5d0 = auVar9._16_8_;
      uStack_5c8 = auVar9._24_8_;
      *(undefined1 (*) [8])local_4f8 = local_5e0;
      *(undefined8 *)(local_4f8 + 2) = uStack_5d8;
      *(undefined8 *)(local_4f8 + 4) = uStack_5d0;
      *(undefined8 *)(local_4f8 + 6) = uStack_5c8;
      local_4f8 = local_4f8 + 8;
    }
    for (; local_550 + 3 < iVar12; local_550 = local_550 + 4) {
      fVar2 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      fVar3 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_280 = (float)*(undefined8 *)local_4f8;
      fStack_27c = (float)((ulong)*(undefined8 *)local_4f8 >> 0x20);
      fStack_278 = (float)*(undefined8 *)(local_4f8 + 2);
      fStack_274 = (float)((ulong)*(undefined8 *)(local_4f8 + 2) >> 0x20);
      local_620 = CONCAT44(fStack_27c * fVar3 + fVar2,local_280 * fVar3 + fVar2);
      uStack_618._0_4_ = fStack_278 * fVar3 + fVar2;
      uStack_618._4_4_ = fStack_274 * fVar3 + fVar2;
      auVar4._8_8_ = uStack_618;
      auVar4._0_8_ = local_620;
      auVar4 = vmaxps_avx(auVar4,ZEXT816(0));
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      auVar4 = vminps_avx(auVar4,auVar5);
      local_620 = auVar4._0_8_;
      uStack_618 = auVar4._8_8_;
      *(undefined8 *)local_4f8 = local_620;
      *(undefined8 *)(local_4f8 + 2) = uStack_618;
      local_4f8 = local_4f8 + 4;
    }
    for (; local_550 < iVar12; local_550 = local_550 + 1) {
      if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *local_4f8) {
        if (*local_4f8 <= *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) {
          *local_4f8 = *local_4f8 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                       *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        }
        else {
          *local_4f8 = 1.0;
        }
      }
      else {
        *local_4f8 = 0.0;
      }
      local_4f8 = local_4f8 + 1;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}